

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FabArrayCommI.H
# Opt level: O0

void __thiscall amrex::FabArray<amrex::CutFab>::ParallelCopy_finish(FabArray<amrex::CutFab> *this)

{
  FabArray<amrex::CutFab> *this_local;
  
  return;
}

Assistant:

void
FabArray<FAB>::ParallelCopy_finish ()
{

#ifdef BL_USE_MPI

    BL_PROFILE("FabArray::ParallelCopy_finish()");
    BL_PROFILE_SYNC_STOP();

    if (!pcd) { return; }

    const CPC* thecpc = pcd->cpc;

    const int N_snds = thecpc->m_SndTags->size();
    const int N_rcvs = thecpc->m_RcvTags->size();

    if (N_rcvs > 0)
    {
        Vector<const CopyComTagsContainer*> recv_cctc(N_rcvs,nullptr);
        for (int k = 0; k < N_rcvs; ++k)
        {
            if (pcd->recv_size[k] > 0)
            {
                auto const& cctc = thecpc->m_RcvTags->at(pcd->recv_from[k]);
                recv_cctc[k] = &cctc;
            }
        }

        if (pcd->actual_n_rcvs > 0) {
            Vector<MPI_Status> stats(N_rcvs);
            ParallelDescriptor::Waitall(pcd->recv_reqs, stats);
#ifdef AMREX_DEBUG
            if (!CheckRcvStats(stats, pcd->recv_size, pcd->tag))
            {
                amrex::Abort("ParallelCopy failed with wrong message size");
            }
#endif
        }

        bool is_thread_safe = thecpc->m_threadsafe_rcv;

#ifdef AMREX_USE_GPU
        if (Gpu::inLaunchRegion())
        {
            unpack_recv_buffer_gpu(*this, pcd->DC, pcd->NC, pcd->recv_data, pcd->recv_size,
                                   recv_cctc, pcd->op, is_thread_safe);
        }
        else
#endif
        {
            unpack_recv_buffer_cpu(*this, pcd->DC, pcd->NC, pcd->recv_data, pcd->recv_size,
                                   recv_cctc, pcd->op, is_thread_safe);
        }

        if (pcd->the_recv_data)
        {
            amrex::The_FA_Arena()->free(pcd->the_recv_data);
            pcd->the_recv_data = nullptr;
        }
    }

    if (N_snds > 0) {
        if (! thecpc->m_SndTags->empty()) {
            Vector<MPI_Status> stats(pcd->send_reqs.size());
            ParallelDescriptor::Waitall(pcd->send_reqs, stats);
        }
        amrex::The_FA_Arena()->free(pcd->the_send_data);
        pcd->the_send_data = nullptr;
    }

    pcd.reset();

#endif /*BL_USE_MPI*/
}